

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

int __thiscall
Centaurus::CATNMachine<char>::import_whitespace
          (CATNMachine<char> *this,CharClass<char> *cc,int origin,int tag)

{
  int iVar1;
  bool local_55;
  int local_54;
  CharClass<char> local_50;
  
  local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_00185b88;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.m_ranges.
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = add_node(this,&local_50,origin,tag);
  local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_00185b88;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            (&local_50.m_ranges);
  local_50._vptr_CharClass = (_func_int **)CONCAT44(local_50._vptr_CharClass._4_4_,iVar1);
  local_54 = 0;
  local_55 = false;
  std::vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>::
  emplace_back<Centaurus::CharClass<char>const&,int&,bool,int&>
            ((vector<Centaurus::NFATransition<char>,std::allocator<Centaurus::NFATransition<char>>>
              *)&(this->m_nodes).
                 super__Vector_base<Centaurus::CATNNode<char>,_std::allocator<Centaurus::CATNNode<char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar1].m_transitions,cc,(int *)&local_50,
             &local_55,&local_54);
  return iVar1;
}

Assistant:

CharClass(const std::initializer_list<wchar_t>& ch_list)
    {
        for (wchar_t ch : ch_list)
        {
            m_ranges.push_back(Range<TCHAR>(ch, ch + 1));
        }
    }